

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O1

int __thiscall Scanner::cleanup_tokens(Scanner *this)

{
  State SVar1;
  
  SVar1 = this->state;
  if (SVar1 == ID_) {
    handle_id(this,' ');
  }
  else {
    if (SVar1 != COLON_) {
      if (SVar1 != QUOTE_) {
        return 0;
      }
      line_error(this,this->last_qoute_line);
    }
    handle_colon(this,' ');
  }
  return 0;
}

Assistant:

int Scanner::cleanup_tokens(void)
{
  if (state == QUOTE_)
  {
    line_error(last_qoute_line);
  }
  else if (state == ID_)
  {
    handle_id(' ');
  }
  else if (state == COLON_)
  {
    handle_colon(' ');
  }
  return 0;
}